

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O2

vector<SingleElements,_std::allocator<SingleElements>_> * __thiscall
ZippedFile::GetInnerElements
          (vector<SingleElements,_std::allocator<SingleElements>_> *__return_storage_ptr__,
          ZippedFile *this,int type)

{
  pointer ppNVar1;
  
  (__return_storage_ptr__->super__Vector_base<SingleElements,_std::allocator<SingleElements>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SingleElements,_std::allocator<SingleElements>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SingleElements,_std::allocator<SingleElements>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(this->super_IContainedElement)._vptr_IContainedElement[3])(this);
  for (ppNVar1 = (this->zip_file_).sub_node_.super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppNVar1 !=
      (this->zip_file_).sub_node_.super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppNVar1 = ppNVar1 + 1) {
    NodeFS::AddElementsToList(*ppNVar1,__return_storage_ptr__,type);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleElements> ZippedFile::GetInnerElements(int type)
{
   std::vector<SingleElements> list;

   int nb_elements = GetNumberOfElements();
   for (std::vector<NodeFS*>::iterator it = zip_file_.sub_node_.begin(); it != zip_file_.sub_node_.end(); it++)
   {
      (*it)->AddElementsToList(list, type);
   }

   return list;
}